

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

int SUNQRAdd_DCGS2_SB(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  uint nvec;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  realtype rVar5;
  double dVar6;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    if (m == 1) {
      N_VDotProdMulti(1,*QRdata,Q,R + mMax);
    }
    else {
      N_VDotProdMultiLocal(m,*QRdata,Q,*(realtype **)((long)QRdata + 0x10));
      nvec = m - 1;
      uVar4 = (ulong)(uint)m;
      N_VDotProdMultiLocal(nvec,Q[nvec],Q,(realtype *)(uVar4 * 8 + *(long *)((long)QRdata + 0x10)));
      N_VDotProdMultiAllReduce(m * 2 + -1,*QRdata,*(realtype **)((long)QRdata + 0x10));
      lVar1 = *(long *)((long)QRdata + 0x10);
      uVar2 = 0;
      do {
        R[(long)(mMax * m) + uVar2] = *(realtype *)(lVar1 + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
      N_VLinearCombination(nvec,(realtype *)(lVar1 + uVar4 * 8),Q,*(N_Vector *)((long)QRdata + 8));
      N_VLinearSum(1.0,Q[nvec],-1.0,*(N_Vector *)((long)QRdata + 8),Q[nvec]);
      uVar2 = 1;
      if (1 < (int)nvec) {
        uVar2 = (ulong)nvec;
      }
      lVar1 = *(long *)((long)QRdata + 0x10);
      uVar3 = 0;
      do {
        R[(long)(int)(nvec * mMax) + uVar3] =
             R[(long)(int)(nvec * mMax) + uVar3] + *(double *)(uVar4 * 8 + lVar1 + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    N_VLinearCombination(m,R + mMax * m,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*QRdata);
  }
  rVar5 = N_VDotProd(*QRdata,*QRdata);
  dVar6 = 0.0;
  if (0.0 < rVar5) {
    rVar5 = N_VDotProd(*QRdata,*QRdata);
    if (rVar5 < 0.0) {
      dVar6 = sqrt(rVar5);
    }
    else {
      dVar6 = SQRT(rVar5);
    }
  }
  R[(mMax + 1) * m] = dVar6;
  N_VScale(1.0 / dVar6,*QRdata,Q[m]);
  return 0;
}

Assistant:

int SUNQRAdd_DCGS2_SB(N_Vector *Q, realtype *R, N_Vector df,
                      int m, int mMax, void *QRdata)
{
    sunindextype j;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* temp = df */

    if (m > 0) {
      if (m == 1) {
        /* R(1:k-1,k) = Q_k-1^T df_aa */
        N_VDotProdMulti(m, qrdata->vtemp, Q, R + m*mMax);
      }
      /* Delayed reorthogonalization */
      else if (m > 1) {
        /* R(1:k-1,k) = Q_k-1^T df_aa */
        /* Put R values at beginning of temp array */
        N_VDotProdMultiLocal(m, qrdata->vtemp, Q, qrdata->temp_array);

        /* s = Q_k-2^T Q(:,k-1) */
        N_VDotProdMultiLocal(m-1, Q[m-1], Q, qrdata->temp_array + m);
        N_VDotProdMultiAllReduce(m + m-1, qrdata->vtemp, qrdata->temp_array);

        /* Move R values to R */
        for (j = 0; j < m; j++) {
          R[m*mMax + j] = qrdata->temp_array[j];
        }

        /* Q(:,k-1) = Q(:,k-1) - Q_k-2 s */
        N_VLinearCombination(m-1, qrdata->temp_array + m, Q, qrdata->vtemp2);
        N_VLinearSum(ONE, Q[m-1], -ONE, qrdata->vtemp2, Q[m-1]);

        /* R(1:k-2,k-1) = R(1:k-2,k-1) + s */
        for (j = 0; j < m-1; j++) {
          R[(m-1) * mMax + j] = R[(m-1) * mMax + j] + qrdata->temp_array[m + j];
        }
      }

      /* df = df - Q(:,k-1) R(1:k-1,k) */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / R(k,k) */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}